

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.h
# Opt level: O2

void __thiscall cmCTestSVN::SVNInfo::~SVNInfo(SVNInfo *this)

{
  std::__cxx11::string::~string((string *)&this->NewRevision);
  std::__cxx11::string::~string((string *)&this->OldRevision);
  std::__cxx11::string::~string((string *)&this->Base);
  std::__cxx11::string::~string((string *)&this->Root);
  std::__cxx11::string::~string((string *)&this->URL);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

SVNInfo(std::string const& path = std::string())
      : LocalPath(path)
    {
    }